

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildElementUnsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,uint32 index,
          RegSlot regSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  Instr *instr_00;
  Opnd *pOVar4;
  IndirOpnd *pIVar5;
  RegOpnd *pRVar6;
  undefined4 *puVar7;
  JitArenaAllocator *pJVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  byte local_111;
  Instr *local_108;
  TrackAllocData local_c8;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_a0;
  StElemInfo *stElemInfo;
  ProfiledInstr *profiledInstr;
  Instr *local_88;
  Instr *tmpInstr;
  Instr *tmpInstrStop;
  Instr *__nextInstrCheck;
  Opnd *defOpnd;
  RegOpnd *local_60;
  RegOpnd *arrayOpnd;
  RegOpnd *pRStack_50;
  OpCode opcode;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  RegOpnd *regOpnd;
  JitProfilingInstr *pJStack_30;
  bool simpleJit;
  Instr *instr;
  uint32 local_20;
  RegSlot regSlot_local;
  uint32 index_local;
  RegSlot baseRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  instr._4_4_ = regSlot;
  local_20 = index;
  regSlot_local = baseRegSlot;
  index_local = offset;
  baseRegSlot_local._2_2_ = newOpcode;
  _offset_local = this;
  regOpnd._7_1_ = Func::DoSimpleJitDynamicProfile(this->m_func);
  switch(baseRegSlot_local._2_2_) {
  case StArrItemI_CI4:
    pRVar6 = BuildSrcOpnd(this,regSlot_local,TyVar);
    pRStack_50 = pRVar6;
    arrayOpnd._0_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    arrayOpnd._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&arrayOpnd,false);
    arrayOpnd._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)((long)&arrayOpnd + 2),TypeIds_Array);
    IR::Opnd::SetValueType(&pRVar6->super_Opnd,(ValueType)arrayOpnd._4_2_);
    IR::Opnd::SetValueTypeFixed(&pRStack_50->super_Opnd);
    arrayOpnd._6_2_ = StElemI_A;
    if ((regOpnd._7_1_ & 1) != 0) {
      arrayOpnd._6_2_ = StElemC;
    }
    break;
  case StArrItemC_CI4:
    pRStack_50 = IR::RegOpnd::New(TyVar,this->m_func);
    pRVar6 = BuildSrcOpnd(this,regSlot_local,TyVar);
    local_60 = pRVar6;
    defOpnd._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    defOpnd._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)((long)&defOpnd + 2),false);
    defOpnd._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)((long)&defOpnd + 4),TypeIds_Array);
    IR::Opnd::SetValueType(&pRVar6->super_Opnd,(ValueType)defOpnd._6_2_);
    IR::Opnd::SetValueTypeFixed(&local_60->super_Opnd);
    instr_00 = IR::Instr::New(LdArrHead,&pRStack_50->super_Opnd,&local_60->super_Opnd,this->m_func);
    AddInstr(this,instr_00,index_local);
    index_local = 0xffffffff;
    arrayOpnd._6_2_ = StArrSegElemC;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1731,"(false)","Unknown ElementUnsigned1 opcode");
    if (bVar2) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case StArrInlineItem_CI4:
    pRStack_50 = BuildSrcOpnd(this,regSlot_local,TyVar);
    if ((pRStack_50->m_sym->field_5).m_instrDef == (Instr *)0x0) {
      local_108 = (Instr *)0x0;
    }
    else {
      local_108 = (Instr *)IR::Instr::GetDst((pRStack_50->m_sym->field_5).m_instrDef);
    }
    __nextInstrCheck = local_108;
    if (local_108 == (Instr *)0x0) {
      tmpInstrStop = (Instr *)0x0;
      tmpInstr = (Instr *)0x0;
      for (local_88 = this->m_func->m_exitInstr->m_prev; local_88 != tmpInstr;
          local_88 = local_88->m_prev) {
        if ((tmpInstrStop != (Instr *)0x0) && (tmpInstrStop->m_prev != local_88)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1715,
                             "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == tmpInstr)"
                             ,"Modifying instr list but not using EDITING iterator!");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        tmpInstrStop = local_88;
        pOVar4 = IR::Instr::GetDst(local_88);
        if (pOVar4 != (Opnd *)0x0) {
          pOVar4 = IR::Instr::GetDst(local_88);
          bVar2 = IR::Opnd::IsEqual(pOVar4,&pRStack_50->super_Opnd);
          if (bVar2) {
            __nextInstrCheck = (Instr *)IR::Instr::GetDst(local_88);
            break;
          }
          if (local_88->m_opcode == StElemC) {
            pOVar4 = IR::Instr::GetDst(local_88);
            pIVar5 = IR::Opnd::AsIndirOpnd(pOVar4);
            pRVar6 = IR::IndirOpnd::GetBaseOpnd(pIVar5);
            bVar2 = IR::Opnd::IsEqual(&pRVar6->super_Opnd,&pRStack_50->super_Opnd);
            if (bVar2) {
              pOVar4 = IR::Instr::GetDst(local_88);
              pIVar5 = IR::Opnd::AsIndirOpnd(pOVar4);
              __nextInstrCheck = (Instr *)IR::IndirOpnd::GetBaseOpnd(pIVar5);
              break;
            }
          }
        }
      }
    }
    if (__nextInstrCheck == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1728,"(defOpnd)","defOpnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pRVar6 = pRStack_50;
    profiledInstr._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)__nextInstrCheck);
    IR::Opnd::SetValueType(&pRVar6->super_Opnd,(ValueType)profiledInstr._6_2_);
    arrayOpnd._6_2_ = StElemC;
    break;
  case StArrSegItem_CI4:
    pRStack_50 = BuildSrcOpnd(this,regSlot_local,TyVar);
    arrayOpnd._6_2_ = StArrSegElemC;
  }
  baseOpnd = (RegOpnd *)BuildIndirOpnd(this,pRStack_50,local_20);
  indirOpnd = (IndirOpnd *)BuildSrcOpnd(this,instr._4_4_,TyVar);
  if ((regOpnd._7_1_ & 1) == 0) {
    local_111 = 0;
    if (arrayOpnd._6_2_ == StElemC) {
      profiledInstr._4_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&pRStack_50->super_Opnd);
      bVar2 = ValueType::IsUninitialized((ValueType *)((long)&profiledInstr + 4));
      local_111 = bVar2 ^ 0xff;
    }
    if ((local_111 & 1) == 0) {
      pJStack_30 = (JitProfilingInstr *)
                   IR::Instr::New(arrayOpnd._6_2_,&baseOpnd->super_Opnd,&indirOpnd->super_Opnd,
                                  this->m_func);
    }
    else {
      stElemInfo = (StElemInfo *)
                   IR::ProfiledInstr::New
                             (arrayOpnd._6_2_,&baseOpnd->super_Opnd,&indirOpnd->super_Opnd,
                              this->m_func);
      pJVar8 = this->m_func->m_alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_c8,(type_info *)&Js::StElemInfo::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                 ,0x1741);
      pJVar8 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar8,&local_c8);
      this_00 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                new<Memory::JitArenaAllocator>(4,pJVar8,0x4e98c0);
      Js::StElemInfo::StElemInfo((StElemInfo *)&this_00->field_0);
      local_a0 = this_00;
      VVar3 = IR::Opnd::GetValueType(&pRStack_50->super_Opnd);
      local_a0->field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar3.field_0;
      *(anon_union_2_4_ea848c7b_for_ValueType_13 **)(stElemInfo + 0x16) = local_a0;
      pJStack_30 = (JitProfilingInstr *)stElemInfo;
    }
  }
  else {
    pJStack_30 = IR::JitProfilingInstr::New
                           (arrayOpnd._6_2_,&baseOpnd->super_Opnd,(Opnd *)indirOpnd,this->m_func);
  }
  AddInstr(this,&pJStack_30->super_Instr,index_local);
  return;
}

Assistant:

void
IRBuilder::BuildElementUnsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, uint32 index, Js::RegSlot regSlot)
{
    // This is an array-style access with a constant (integer) index.
    // Embed the index in the indir opnd as a constant offset.

    IR::Instr *     instr;

    const bool simpleJit = m_func->DoSimpleJitDynamicProfile();

    IR::RegOpnd *   regOpnd;
    IR::IndirOpnd * indirOpnd;
    IR::RegOpnd * baseOpnd;
    Js::OpCode opcode;
    switch (newOpcode)
    {
    case Js::OpCode::StArrItemI_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            baseOpnd->SetValueTypeFixed();

            // In the case of simplejit, we won't know the exact type of array used until run time. Due to this,
            //    we must use the specialized version of StElemC in Lowering.
            opcode = simpleJit ? Js::OpCode::StElemC : Js::OpCode::StElemI_A;
            break;
        }

    case Js::OpCode::StArrItemC_CI4:
        {
            baseOpnd = IR::RegOpnd::New(TyVar, m_func);
            // Insert LdArrHead as the next instr and clear the offset to avoid duplication.
            IR::RegOpnd *const arrayOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            arrayOpnd->SetValueTypeFixed();

            this->AddInstr(IR::Instr::New(Js::OpCode::LdArrHead, baseOpnd, arrayOpnd, m_func), offset);
            offset = Js::Constants::NoByteCodeOffset;
            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrSegItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot, TyVar);

            // This instruction must not create missing values in the array

            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrInlineItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            IR::Opnd *defOpnd = baseOpnd->m_sym->m_instrDef ? baseOpnd->m_sym->m_instrDef->GetDst() : nullptr;
            if (!defOpnd)
            {
                // The array sym may be multi-def because of oddness in the renumbering of temps -- for instance,
                // if there's a loop increment expression whose result is unused (ExprGen only, probably).
                FOREACH_INSTR_BACKWARD(tmpInstr, m_func->m_exitInstr->m_prev)
                {
                    if (tmpInstr->GetDst())
                    {
                        if (tmpInstr->GetDst()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst();
                            break;
                        }
                        else if (tmpInstr->m_opcode == Js::OpCode::StElemC &&
                                 tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
                            break;
                        }
                    }
                }
                NEXT_INSTR_BACKWARD;
            }
            AnalysisAssert(defOpnd);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(defOpnd->GetValueType());

            opcode = Js::OpCode::StElemC;
            break;
        }
    default:
        AssertMsg(false, "Unknown ElementUnsigned1 opcode");
        return;

    }

    indirOpnd = this->BuildIndirOpnd(baseOpnd, index);
    regOpnd = this->BuildSrcOpnd(regSlot);
    if (simpleJit)
    {
        instr = IR::JitProfilingInstr::New(opcode, indirOpnd, regOpnd, m_func);
    }
    else if(opcode == Js::OpCode::StElemC && !baseOpnd->GetValueType().IsUninitialized())
    {
        // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
        // ProfiledInstr.
        IR::ProfiledInstr *const profiledInstr = IR::ProfiledInstr::New(opcode, indirOpnd, regOpnd, m_func);
        Js::StElemInfo *const stElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo);
        stElemInfo->arrayType = baseOpnd->GetValueType();
        profiledInstr->u.stElemInfo = stElemInfo;
        instr = profiledInstr;
    }
    else
    {
        instr = IR::Instr::New(opcode, indirOpnd, regOpnd, m_func);
    }

    this->AddInstr(instr, offset);
}